

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
::get(SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
      *this,ExceptionOrValue *output)

{
  bool bVar1;
  bool bVar2;
  ExceptionOrValue *pEVar3;
  PromiseArenaMember *pPVar4;
  Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
  *value;
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *paVar5;
  
  pEVar3 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  bVar1 = pEVar3[1].exception.ptr.isSet;
  paVar5 = (anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *)0x0;
  if (bVar1 != false) {
    paVar5 = &pEVar3[1].exception.ptr.field_1;
  }
  bVar2 = output[1].exception.ptr.isSet;
  if (bVar1 == true) {
    if (bVar2 != false) {
      output[1].exception.ptr.isSet = false;
      pPVar4 = (PromiseArenaMember *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
      if (pPVar4 != (PromiseArenaMember *)0x0) {
        output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        PromiseDisposer::dispose(pPVar4);
      }
    }
    output[1].exception.ptr.field_1.value.ownFile.content.ptr = (paVar5->value).ownFile.content.ptr;
    (paVar5->value).ownFile.content.ptr = (char *)0x0;
    output[1].exception.ptr.isSet = true;
  }
  else if (bVar2 != false) {
    output[1].exception.ptr.isSet = false;
    pPVar4 = (PromiseArenaMember *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      PromiseDisposer::dispose(pPVar4);
    }
  }
  if (pEVar3 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar3->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar3->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(value));
    } else {
      output.as<Element>().value = kj::none;
    }